

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O2

void __thiscall
Imf_2_5::ScanLineInputFile::ScanLineInputFile(ScanLineInputFile *this,InputPartData *part)

{
  InputStreamMutex *pIVar1;
  bool bVar2;
  int iVar3;
  string *__lhs;
  Data *pDVar4;
  ArgExc *this_00;
  size_t i;
  
  GenericInputFile::GenericInputFile(&this->super_GenericInputFile);
  (this->super_GenericInputFile)._vptr_GenericInputFile =
       (_func_int **)&PTR__ScanLineInputFile_03012dd0;
  __lhs = Header::type_abi_cxx11_(&part->header);
  bVar2 = std::operator!=(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )SCANLINEIMAGE_abi_cxx11_);
  if (!bVar2) {
    pDVar4 = (Data *)operator_new(0x168);
    Data::Data(pDVar4,part->numThreads);
    this->_data = pDVar4;
    pIVar1 = part->mutex;
    this->_streamData = pIVar1;
    iVar3 = (*pIVar1->is->_vptr_IStream[2])();
    pDVar4 = this->_data;
    pDVar4->memoryMapped = SUB41(iVar3,0);
    pDVar4->version = part->version;
    initialize(this,&part->header);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              (&this->_data->lineOffsets,&part->chunkOffsets);
    pDVar4 = this->_data;
    pDVar4->partNumber = part->partNumber;
    pDVar4->fileIsComplete = true;
    return;
  }
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::ArgExc::ArgExc(this_00,"Can\'t build a ScanLineInputFile from a type-mismatched part.");
  __cxa_throw(this_00,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
}

Assistant:

ScanLineInputFile::ScanLineInputFile(InputPartData* part)
{
    if (part->header.type() != SCANLINEIMAGE)
        throw IEX_NAMESPACE::ArgExc("Can't build a ScanLineInputFile from a type-mismatched part.");

    _data = new Data(part->numThreads);
    _streamData = part->mutex;
    _data->memoryMapped = _streamData->is->isMemoryMapped();

    _data->version = part->version;

    try
    {
       initialize(part->header);
    }
    catch(...)
    {
        if (!_data->memoryMapped)
        {
            for (size_t i = 0; i < _data->lineBuffers.size(); i++)
            {
                if( _data->lineBuffers[i] )
                {
                   EXRFreeAligned(_data->lineBuffers[i]->buffer);
                   _data->lineBuffers[i]->buffer=nullptr;
                }
            }
        }
        
        delete _data;
        throw;
    }
    _data->lineOffsets = part->chunkOffsets;

    _data->partNumber = part->partNumber;
    //
    // (TODO) change this code later.
    // The completeness of the file should be detected in MultiPartInputFile.
    //
    _data->fileIsComplete = true;
}